

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::BufferMapInvalidateCase::iterate(BufferMapInvalidateCase *this)

{
  CallLogWrapper *this_00;
  deUint32 seed;
  deUint32 buffer;
  uint uVar1;
  GLenum GVar2;
  int iVar3;
  void *pvVar4;
  TestError *this_01;
  char *description;
  uint uVar5;
  uint numBytes;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  
  seed = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                     );
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            (&verifier,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
             this->m_verify);
  uVar5 = 0x5b;
  if (this->m_partialWrite == false) {
    uVar5 = 0;
  }
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&refBuf,0x514);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,0x514,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_bufferTarget,0x514,
             refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_usage);
  uVar1 = uVar5 + 200;
  numBytes = 0x3f3 - uVar5;
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start + uVar1,numBytes,seed & 0xabcdef);
  pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,this->m_bufferTarget,200,0x3f3,10);
  GVar2 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar2,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0xf9);
  if (pvVar4 != (void *)0x0) {
    memcpy((void *)((long)pvVar4 + (ulong)uVar5),
           refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + uVar1,(ulong)numBytes);
    glu::CallLogWrapper::glUnmapBuffer(this_00,this->m_bufferTarget);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar2,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0xfe);
    iVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                      (&verifier,(EVP_PKEY_CTX *)(ulong)buffer,
                       refBuf.m_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,(ulong)uVar1,(uchar *)(ulong)numBytes,
                       (ulong)this->m_bufferTarget);
    deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
    description = "Buffer verification failed";
    if ((byte)iVar3 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(byte)((byte)iVar3 ^ 1),description);
    deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&verifier);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&refBuf);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0xfa);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed		= deStringHash(getName());
		deUint32		buf				= 0;
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier		(m_renderCtx, m_testCtx.getLog(), m_verify);
		const int		bufferSize		= 1300;
		const int		mapOffset		= 200;
		const int		mapSize			= 1011;
		const int		mapWriteOffs	= m_partialWrite ? 91 : 0;
		const int		verifyOffset	= mapOffset+mapWriteOffs;
		const int		verifySize		= mapSize-mapWriteOffs;

		// Setup reference data.
		refBuf.setSize(bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), bufferSize, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, bufferSize, refBuf.getPtr(), m_usage);

		// Do reference map.
		fillWithRandomBytes(refBuf.getPtr(mapOffset+mapWriteOffs), mapSize-mapWriteOffs, dataSeed&0xabcdef);

		void* ptr = glMapBufferRange(m_bufferTarget, mapOffset, mapSize, GL_MAP_WRITE_BIT|GL_MAP_INVALIDATE_BUFFER_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		deMemcpy((deUint8*)ptr+mapWriteOffs, refBuf.getPtr(mapOffset+mapWriteOffs), mapSize-mapWriteOffs);
		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		bool isOk = verifier.verify(buf, refBuf.getPtr(), verifyOffset, verifySize, m_bufferTarget);
		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}